

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O2

int base64_tests(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = test_json(&Monster,"{ \"name\": \"Monster\" }","{\"name\":\"Monster\"}",0,0,0,0x174);
  uVar2 = test_json(&Monster,"{ \"name\": \"Monster\", \"testbase64\":{} }",
                    "{\"name\":\"Monster\",\"testbase64\":{}}",0,0,0,0x177);
  uVar3 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testbase64\":{ \"data\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY/5pKYmk+54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG+64Zv+Uygw==\"} }"
                    ,
                    "{\"name\":\"Monster\",\"testbase64\":{\"data\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY/5pKYmk+54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG+64Zv+Uygw==\"}}"
                    ,0,0,0,0x17b);
  uVar4 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testbase64\":{ \"urldata\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY_5pKYmk-54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG-64Zv-Uygw==\"} }"
                    ,
                    "{\"name\":\"Monster\",\"testbase64\":{\"urldata\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY_5pKYmk-54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG-64Zv-Uygw==\"}}"
                    ,0,0,0,0x17e);
  uVar5 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testbase64\":{ \"data\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY/5pKYmk+54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG+64Zv+Uygw\"} }"
                    ,
                    "{\"name\":\"Monster\",\"testbase64\":{\"data\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY/5pKYmk+54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG+64Zv+Uygw==\"}}"
                    ,0,0,0,0x181);
  uVar6 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testbase64\":{ \"urldata\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY_5pKYmk-54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG-64Zv-Uygw\"} }"
                    ,
                    "{\"name\":\"Monster\",\"testbase64\":{\"urldata\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY_5pKYmk-54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG-64Zv-Uygw==\"}}"
                    ,0,0,0,0x184);
  uVar7 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testbase64\":{ \"data\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY_5pKYmk-54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG-64Zv-Uygw==\"} }"
                    ,(char *)0x0,0x1f,0,0,0x187);
  uVar8 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"testbase64\":{ \"urldata\":\"zLOuiUjH49tz4Ap2JnmpTX5NqoiMzlD8hSw45QCS2yaSp7UYoAoE8KpY/5pKYmk+54NI40hyeyZ1zRUE4vKQT0hEdVl0iXq2fqPamkVD1AZlVvQJ1m00PaoXOSgG+64Zv+Uygw==\"} }"
                    ,(char *)0x0,0x20,0,0,0x18a);
  return uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int base64_tests(void)
{
    BEGIN_TEST(Monster);

    /* Reference */
    TEST(   "{ \"name\": \"Monster\" }",
            "{\"name\":\"Monster\"}");

    TEST(   "{ \"name\": \"Monster\", \"testbase64\":{} }",
            "{\"name\":\"Monster\",\"testbase64\":{}}");


    TEST(   "{ \"name\": \"Monster\", \"testbase64\":{ \"data\":\"" RANDOM_BASE64 "\"} }",
            "{\"name\":\"Monster\",\"testbase64\":{\"data\":\"" RANDOM_BASE64 "\"}}");

    TEST(   "{ \"name\": \"Monster\", \"testbase64\":{ \"urldata\":\"" RANDOM_BASE64URL "\"} }",
            "{\"name\":\"Monster\",\"testbase64\":{\"urldata\":\"" RANDOM_BASE64URL "\"}}");

    TEST(   "{ \"name\": \"Monster\", \"testbase64\":{ \"data\":\"" RANDOM_BASE64_NOPAD "\"} }",
            "{\"name\":\"Monster\",\"testbase64\":{\"data\":\"" RANDOM_BASE64 "\"}}");

    TEST(   "{ \"name\": \"Monster\", \"testbase64\":{ \"urldata\":\"" RANDOM_BASE64URL_NOPAD "\"} }",
            "{\"name\":\"Monster\",\"testbase64\":{\"urldata\":\"" RANDOM_BASE64URL "\"}}");

    TEST_ERROR(   "{ \"name\": \"Monster\", \"testbase64\":{ \"data\":\"" RANDOM_BASE64URL "\"} }",
            flatcc_json_parser_error_base64);

    TEST_ERROR(   "{ \"name\": \"Monster\", \"testbase64\":{ \"urldata\":\"" RANDOM_BASE64 "\"} }",
            flatcc_json_parser_error_base64url);

/* Test case from Googles flatc implementation. */
#if UQ
    TEST(    "{name: \"Monster\","
            "testbase64: {"
            "data: \"23A/47d450+sdfx9+wRYIS09ckas/asdFBQ=\","
            "urldata: \"23A_47d450-sdfx9-wRYIS09ckas_asdFBQ=\","
            "nested: \"FAAAAE1PTlMMAAwAAAAEAAYACAAMAAAAAAAAAAQAAAANAAAATmVzdGVkTW9uc3RlcgAAAA==\""
            "}}",
            "{\"name\":\"Monster\","
            "\"testbase64\":{"
            "\"data\":\"23A/47d450+sdfx9+wRYIS09ckas/asdFBQ=\","
            "\"urldata\":\"23A_47d450-sdfx9-wRYIS09ckas_asdFBQ=\","
            "\"nested\":\"FAAAAE1PTlMMAAwAAAAEAAYACAAMAAAAAAAAAAQAAAANAAAATmVzdGVkTW9uc3RlcgAAAA==\""
            "}}");

    TEST(   "{name: \"Monster\","
            "testbase64: {"
            "data: \"23A/47d450+sdfx9+wRYIS09ckas/asdFBQ\","
            "urldata: \"23A_47d450-sdfx9-wRYIS09ckas_asdFBQ\","
            "nested: \"FAAAAE1PTlMMAAwAAAAEAAYACAAMAAAAAAAAAAQAAAANAAAATmVzdGVkTW9uc3RlcgAAAA\""
            "}}",
            "{\"name\":\"Monster\","
            "\"testbase64\":{"
            "\"data\":\"23A/47d450+sdfx9+wRYIS09ckas/asdFBQ=\","
            "\"urldata\":\"23A_47d450-sdfx9-wRYIS09ckas_asdFBQ=\","
            "\"nested\":\"FAAAAE1PTlMMAAwAAAAEAAYACAAMAAAAAAAAAAQAAAANAAAATmVzdGVkTW9uc3RlcgAAAA==\""
            "}}");
#endif

    END_TEST();
}